

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniserver.c
# Opt level: O2

int get_port(SOCKET sockfd,uint16_t *port)

{
  ushort uVar1;
  int iVar2;
  socklen_t len;
  sockaddr_storage sockinfo;
  
  len = 0x80;
  iVar2 = getsockname(sockfd,(sockaddr *)&sockinfo,&len);
  if (iVar2 == -1) {
    iVar2 = -1;
  }
  else {
    if ((sockinfo.ss_family == 2) || (sockinfo.ss_family == 10)) {
      uVar1 = sockinfo.__ss_padding._0_2_ << 8 | (ushort)sockinfo.__ss_padding._0_2_ >> 8;
      *port = uVar1;
    }
    else {
      uVar1 = *port;
    }
    iVar2 = 0;
    UpnpPrintf(UPNP_INFO,MSERV,".upnp/src/genlib/miniserver/miniserver.c",0x2e0,
               "sockfd = %d, .... port = %d\n",sockfd,(uint)uVar1);
  }
  return iVar2;
}

Assistant:

static int get_port(
	/*! [in] Socket descriptor. */
	SOCKET sockfd,
	/*! [out] The port value if successful, otherwise, untouched. */
	uint16_t *port)
{
	struct sockaddr_storage sockinfo;
	socklen_t len;
	int code;

	len = sizeof(sockinfo);
	code = getsockname(sockfd, (struct sockaddr *)&sockinfo, &len);
	if (code == -1) {
		return -1;
	}
	if (sockinfo.ss_family == AF_INET) {
		*port = ntohs(((struct sockaddr_in *)&sockinfo)->sin_port);
	} else if (sockinfo.ss_family == AF_INET6) {
		*port = ntohs(((struct sockaddr_in6 *)&sockinfo)->sin6_port);
	}
	UpnpPrintf(UPNP_INFO,
		MSERV,
		__FILE__,
		__LINE__,
		"sockfd = %d, .... port = %d\n",
		sockfd,
		(int)*port);

	return 0;
}